

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.hpp
# Opt level: O1

void duckdb::ParquetDecodeUtils::BitUnpackAlignedInternal<unsigned_char>
               (ByteBuffer *src,uchar *dst,idx_t count,bitpacking_width_t width)

{
  data_ptr_t pdVar1;
  long lVar2;
  ulong uVar3;
  uint8_t *in;
  ulong uVar4;
  
  if (count != 0) {
    pdVar1 = src->ptr;
    uVar4 = 0;
    uVar3 = 0;
    do {
      in = pdVar1 + (uVar4 >> 3);
      lVar2 = 0;
      do {
        duckdb_fastpforlib::internal::fastunpack_quarter(in,dst + lVar2,(uint)width);
        lVar2 = lVar2 + 8;
        in = in + width;
      } while (lVar2 != 0x20);
      uVar3 = uVar3 + 0x20;
      dst = dst + 0x20;
      uVar4 = uVar4 + (ulong)width * 0x20;
    } while (uVar3 < count);
  }
  uVar3 = width * count >> 3;
  src->len = src->len - uVar3;
  src->ptr = src->ptr + uVar3;
  return;
}

Assistant:

static void BitUnpackAlignedInternal(ByteBuffer &src, T *dst, const idx_t count, const bitpacking_width_t width) {
		D_ASSERT(count % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE == 0);
		if (cast_pointer_to_uint64(src.ptr) % sizeof(T) == 0) {
			// Fast path: aligned
			BitpackingPrimitives::UnPackBuffer<T>(data_ptr_cast(dst), src.ptr, count, width);
			src.unsafe_inc(count * width / BITPACK_DLEN);
			return;
		}

		for (idx_t i = 0; i < count; i += BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE) {
			const auto next_read = BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE * width / BITPACK_DLEN;

			// Buffer for alignment
			T aligned_data[BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE];

			// Copy over to aligned buffer
			FastMemcpy(aligned_data, src.ptr, next_read);

			// Unpack
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(dst), data_ptr_cast(aligned_data), width, true);

			src.unsafe_inc(next_read);
			dst += BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;
		}
	}